

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sssort.c
# Opt level: O3

void ss_swapmerge(sauchar_t *T,saidx_t *PA,saidx_t *first,saidx_t *middle,saidx_t *last,saidx_t *buf
                 ,saidx_t bufsize,saidx_t depth)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int *piVar5;
  uint *puVar6;
  uint *puVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  byte *pbVar11;
  byte bVar12;
  ulong uVar13;
  byte *pbVar14;
  ulong uVar15;
  long lVar16;
  uint *puVar17;
  uint *puVar18;
  byte bVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  uint *puVar23;
  uint *puVar24;
  sauchar_t *psVar25;
  uint uVar26;
  sauchar_t *psVar27;
  byte *pbVar28;
  bool bVar29;
  bool bVar30;
  int *local_498;
  undefined8 local_458 [3];
  uint local_440 [2];
  long local_438 [3];
  uint auStack_420 [252];
  
  lVar20 = (long)depth;
  iVar21 = 0;
  uVar26 = 0;
LAB_001034f4:
  uVar22 = (long)last - (long)middle;
  uVar15 = (long)uVar22 >> 2;
  if ((long)uVar15 <= (long)bufsize) {
    if ((middle < last) && (first < middle)) {
      iVar10 = (int)(uVar22 >> 2);
      if (0 < iVar10) {
        uVar3 = iVar10 + 1;
        lVar16 = 0;
        do {
          uVar1 = *(undefined4 *)((long)buf + lVar16);
          *(undefined4 *)((long)buf + lVar16) = *(undefined4 *)((long)middle + lVar16);
          *(undefined4 *)((long)middle + lVar16) = uVar1;
          lVar16 = lVar16 + 4;
          uVar3 = uVar3 - 1;
        } while (1 < uVar3);
      }
      puVar23 = (uint *)((long)buf + (uVar22 - 4));
      uVar3 = (int)*puVar23 >> 0x1f;
      local_498 = PA + (uVar3 ^ *puVar23);
      puVar6 = (uint *)middle + -1;
      uVar8 = (int)((uint *)middle)[-1] >> 0x1f;
      uVar3 = uVar8 * -2 - uVar3;
      piVar5 = PA + (uVar8 ^ ((uint *)middle)[-1]);
      puVar7 = (uint *)last + -1;
      uVar8 = ((uint *)last)[-1];
LAB_001038ad:
      while( true ) {
        pbVar14 = T + *local_498 + lVar20;
        pbVar11 = T + *piVar5 + lVar20;
        pbVar28 = T + (long)piVar5[1] + 2;
        bVar29 = pbVar11 < pbVar28;
        bVar30 = pbVar14 < T + (long)local_498[1] + 2;
        puVar24 = (uint *)buf;
        if ((bVar30) && (pbVar11 < pbVar28)) {
          psVar25 = T + *local_498;
          psVar27 = T + *piVar5;
          do {
            bVar12 = psVar25[lVar20];
            bVar19 = psVar27[lVar20];
            if (bVar12 != bVar19) goto LAB_00103955;
            pbVar14 = psVar25 + lVar20 + 1;
            pbVar11 = psVar27 + lVar20 + 1;
            bVar29 = pbVar11 < pbVar28;
            psVar25 = psVar25 + 1;
            psVar27 = psVar27 + 1;
            bVar30 = pbVar14 < T + (long)local_498[1] + 2;
          } while ((bVar30) && (pbVar11 < pbVar28));
          pbVar14 = psVar25 + lVar20;
          pbVar11 = psVar27 + lVar20;
        }
        if (!bVar30) break;
        if (bVar29 != false) {
          bVar12 = *pbVar14;
          bVar19 = *pbVar11;
LAB_00103955:
          iVar10 = (uint)bVar12 - (uint)bVar19;
          if (iVar10 == 0 || (uint)bVar12 < (uint)bVar19) goto LAB_0010398c;
        }
        uVar9 = *puVar23;
        puVar18 = puVar23;
        if ((uVar3 & 1) != 0) {
          do {
            *puVar7 = uVar9;
            puVar18 = puVar7 + -1;
            puVar7 = puVar7 + -1;
            *puVar23 = *puVar18;
            uVar9 = puVar23[-1];
            puVar23 = puVar23 + -1;
          } while ((int)uVar9 < 0);
          uVar3 = uVar3 & 0xfffffffe;
          puVar18 = puVar23;
        }
        *puVar7 = uVar9;
        if (puVar18 <= buf) goto LAB_00104225;
        puVar7 = puVar7 + -1;
        puVar23 = puVar18 + -1;
        *puVar18 = *puVar7;
        uVar9 = puVar18[-1];
        if ((long)(int)uVar9 < 0) {
          local_498 = PA + ~uVar9;
          uVar3 = uVar3 | 1;
        }
        else {
          local_498 = PA + (int)uVar9;
        }
      }
      iVar10 = -(uint)bVar29;
LAB_0010398c:
      if (iVar10 < 0) {
        uVar9 = *puVar6;
        if ((uVar3 & 2) != 0) {
          do {
            *puVar7 = uVar9;
            puVar24 = puVar7 + -1;
            puVar7 = puVar7 + -1;
            *puVar6 = *puVar24;
            uVar9 = puVar6[-1];
            puVar6 = puVar6 + -1;
          } while ((int)uVar9 < 0);
          uVar3 = uVar3 & 0xfffffffd;
        }
        *puVar7 = uVar9;
        puVar24 = puVar7 + -1;
        puVar7 = puVar7 + -1;
        *puVar6 = *puVar24;
        puVar6 = puVar6 + -1;
        if (puVar6 < first) goto joined_r0x00103f54;
        uVar9 = *puVar6;
        uVar2 = ~uVar9;
        if (-1 < (int)uVar9) {
          uVar2 = uVar9;
        }
        if (-1 >= (int)uVar9) {
          uVar3 = uVar3 | 2;
        }
        piVar5 = PA + uVar2;
        goto LAB_001038ad;
      }
      uVar9 = *puVar23;
      if ((uVar3 & 1) != 0) {
        do {
          *puVar7 = uVar9;
          puVar18 = puVar7 + -1;
          puVar7 = puVar7 + -1;
          *puVar23 = *puVar18;
          uVar9 = puVar23[-1];
          puVar23 = puVar23 + -1;
        } while ((int)uVar9 < 0);
        uVar3 = uVar3 & 0xfffffffe;
      }
      *puVar7 = ~uVar9;
      if (puVar23 <= buf) goto LAB_00104225;
      puVar24 = puVar7 + -1;
      *puVar23 = puVar7[-1];
      uVar9 = *puVar6;
      if ((uVar3 & 2) != 0) {
        do {
          *puVar24 = uVar9;
          puVar7 = puVar24 + -1;
          puVar24 = puVar24 + -1;
          *puVar6 = *puVar7;
          uVar9 = puVar6[-1];
          puVar6 = puVar6 + -1;
        } while ((int)uVar9 < 0);
        uVar3 = 0;
      }
      puVar23 = puVar23 + -1;
      *puVar24 = uVar9;
      puVar7 = puVar24 + -1;
      *puVar6 = puVar24[-1];
      puVar6 = puVar6 + -1;
      if (first <= puVar6) {
        uVar9 = *puVar23;
        uVar3 = uVar9 >> 0x1f | uVar3;
        local_498 = PA + ((int)uVar9 >> 0x1f ^ uVar9);
        uVar9 = *puVar6;
        if ((long)(int)uVar9 < 0) {
          piVar5 = PA + ~uVar9;
          uVar3 = uVar3 | 2;
        }
        else {
          piVar5 = PA + (int)uVar9;
        }
        goto LAB_001038ad;
      }
      for (; buf < puVar23; puVar23 = puVar23 + -1) {
        *puVar7 = *puVar23;
        *puVar23 = puVar7[-1];
        puVar7 = puVar7 + -1;
      }
      goto LAB_00104220;
    }
    goto LAB_0010422d;
  }
  local_498 = (int *)((long)middle - (long)first);
  uVar4 = (long)local_498 >> 2;
  if ((long)uVar4 <= (long)bufsize) {
    if (first < middle) {
      iVar10 = (int)((ulong)local_498 >> 2);
      if (0 < iVar10) {
        uVar3 = iVar10 + 1;
        lVar16 = 0;
        do {
          uVar1 = *(undefined4 *)((long)buf + lVar16);
          *(undefined4 *)((long)buf + lVar16) = *(undefined4 *)((long)first + lVar16);
          *(undefined4 *)((long)first + lVar16) = uVar1;
          lVar16 = lVar16 + 4;
          uVar3 = uVar3 - 1;
        } while (1 < uVar3);
      }
      puVar6 = (uint *)((long)buf + ((long)local_498 - 4U));
      uVar3 = *first;
      puVar23 = (uint *)buf;
      puVar7 = (uint *)first;
      do {
        while( true ) {
          uVar22 = (ulong)(int)*puVar23;
          uVar15 = (ulong)*middle;
          pbVar14 = T + PA[uVar22] + lVar20;
          pbVar28 = T + PA[uVar15] + lVar20;
          pbVar11 = T + (long)PA[uVar15 + 1] + 2;
          bVar29 = pbVar28 < pbVar11;
          bVar30 = pbVar14 < T + (long)PA[uVar22 + 1] + 2;
          puVar24 = puVar7;
          puVar18 = (uint *)middle;
          if ((bVar30) && (pbVar28 < pbVar11)) {
            psVar27 = T + PA[uVar22];
            psVar25 = T + PA[uVar15];
            do {
              bVar12 = psVar27[lVar20];
              bVar19 = psVar25[lVar20];
              if (bVar12 != bVar19) goto LAB_00103c45;
              pbVar14 = psVar27 + lVar20 + 1;
              pbVar28 = psVar25 + lVar20 + 1;
              bVar29 = pbVar28 < pbVar11;
              psVar27 = psVar27 + 1;
              psVar25 = psVar25 + 1;
              bVar30 = pbVar14 < T + (long)PA[uVar22 + 1] + 2;
            } while ((bVar30) && (pbVar28 < pbVar11));
            pbVar14 = psVar27 + lVar20;
            pbVar28 = psVar25 + lVar20;
          }
          if (!bVar30) break;
          if (bVar29 != false) {
            bVar12 = *pbVar14;
            bVar19 = *pbVar28;
LAB_00103c45:
            iVar10 = (uint)bVar12 - (uint)bVar19;
            goto LAB_00103c5b;
          }
LAB_00103c6e:
          do {
            middle = (saidx_t *)(puVar18 + 1);
            puVar7 = puVar24 + 1;
            *puVar24 = (uint)uVar15;
            *puVar18 = *puVar7;
            if (last <= middle) goto joined_r0x00103f8e;
            uVar15 = (ulong)(uint)*middle;
            puVar24 = puVar7;
            puVar18 = (uint *)middle;
          } while (*middle < 0);
        }
        iVar10 = -(uint)bVar29;
LAB_00103c5b:
        puVar17 = puVar23;
        if (iVar10 < 0) {
          do {
            *puVar7 = (uint)uVar22;
            if (puVar6 <= puVar17) goto LAB_00103ff8;
            puVar24 = puVar7 + 1;
            puVar7 = puVar7 + 1;
            puVar23 = puVar17 + 1;
            *puVar17 = *puVar24;
            puVar24 = puVar17 + 1;
            uVar22 = (ulong)*puVar24;
            puVar17 = puVar23;
          } while ((int)*puVar24 < 0);
        }
        else {
          if (iVar10 != 0) goto LAB_00103c6e;
          *middle = ~*middle;
          uVar8 = *puVar23;
          puVar24 = puVar7 + 2;
          puVar18 = puVar23;
          do {
            puVar17 = puVar24;
            *puVar7 = uVar8;
            if (puVar6 <= puVar18) goto LAB_00103ff8;
            puVar24 = puVar7 + 1;
            puVar7 = puVar7 + 1;
            puVar23 = puVar18 + 1;
            *puVar18 = *puVar24;
            uVar8 = puVar18[1];
            puVar24 = puVar17 + 1;
            puVar18 = puVar23;
          } while ((int)uVar8 < 0);
          uVar8 = *middle;
          puVar24 = (uint *)middle;
          do {
            puVar7 = puVar17;
            middle = (saidx_t *)(puVar24 + 1);
            puVar7[-1] = uVar8;
            *puVar24 = *puVar7;
            if (last <= middle) goto joined_r0x001041b3;
            uVar8 = *middle;
            puVar17 = puVar7 + 1;
            puVar24 = (uint *)middle;
          } while ((int)uVar8 < 0);
        }
      } while( true );
    }
    goto LAB_00103ffb;
  }
  if ((long)uVar4 < (long)uVar15) {
    uVar15 = uVar4;
  }
  if (0 < (int)uVar15) {
    uVar3 = 0;
    do {
      uVar8 = (uint)uVar15;
      uVar15 = uVar15 >> 1 & 0x7fffffff;
      uVar4 = (ulong)((int)((uint *)middle)[(long)(int)uVar3 + uVar15] >> 0x1f ^
                     ((uint *)middle)[(long)(int)uVar3 + uVar15]);
      uVar13 = (ulong)((int)((uint *)middle)[(-1 - uVar15) - (long)(int)uVar3] >> 0x1f ^
                      ((uint *)middle)[(-1 - uVar15) - (long)(int)uVar3]);
      pbVar14 = T + PA[uVar4] + lVar20;
      pbVar28 = T + PA[uVar13] + lVar20;
      pbVar11 = T + (long)PA[uVar13 + 1] + 2;
      bVar29 = pbVar28 < pbVar11;
      bVar30 = pbVar14 < T + (long)PA[uVar4 + 1] + 2;
      if ((bVar30) && (pbVar28 < pbVar11)) {
        psVar27 = T + PA[uVar4];
        psVar25 = T + PA[uVar13];
        do {
          bVar12 = psVar27[lVar20];
          if (bVar12 != psVar25[lVar20]) {
            pbVar28 = psVar25 + lVar20;
            goto LAB_0010361d;
          }
          pbVar14 = psVar27 + lVar20 + 1;
          pbVar28 = psVar25 + lVar20 + 1;
          bVar29 = pbVar28 < pbVar11;
          psVar27 = psVar27 + 1;
          psVar25 = psVar25 + 1;
          bVar30 = pbVar14 < T + (long)PA[uVar4 + 1] + 2;
        } while ((bVar30) && (pbVar28 < pbVar11));
        pbVar14 = psVar27 + lVar20;
        pbVar28 = psVar25 + lVar20;
      }
      if (bVar30) {
        if (bVar29) {
          bVar12 = *pbVar14;
LAB_0010361d:
          if (bVar12 < *pbVar28) goto LAB_00103622;
        }
      }
      else if (bVar29) {
LAB_00103622:
        uVar3 = uVar3 + (int)uVar15 + 1;
        uVar15 = (ulong)((int)uVar15 - (~uVar8 & 1));
      }
    } while (0 < (int)uVar15);
    if (0 < (int)uVar3) {
      uVar15 = (ulong)uVar3;
      puVar7 = (uint *)middle + -uVar15;
      uVar3 = uVar3 + 1;
      puVar23 = (uint *)middle;
      do {
        uVar8 = puVar23[-uVar15];
        puVar23[-uVar15] = *puVar23;
        *puVar23 = uVar8;
        puVar23 = puVar23 + 1;
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
      puVar24 = (uint *)middle + uVar15;
      puVar6 = (uint *)middle;
      puVar23 = (uint *)middle;
      uVar3 = 0;
      if (puVar24 < last) {
        if ((int)*puVar24 < 0) {
          *puVar24 = ~*puVar24;
          uVar3 = 1;
          if (first < puVar7) {
            do {
              local_498 = (int *)((long)local_498 - 4);
              puVar18 = puVar6 + -1;
              puVar6 = puVar6 + -1;
            } while ((int)*puVar18 < 0);
            uVar3 = 5;
          }
        }
        else {
          uVar3 = 0;
          if (first < puVar7) {
            puVar23 = (uint *)middle + -1;
            uVar22 = (long)last + (4 - (long)middle);
            do {
              uVar22 = uVar22 - 4;
              puVar18 = puVar23 + 1;
              puVar23 = puVar23 + 1;
            } while ((int)*puVar18 < 0);
            uVar3 = 2;
          }
        }
      }
      if ((long)uVar22 < (long)local_498) {
        uVar8 = uVar3 ^ 6;
        if ((uVar3 & 2) == 0) {
          uVar8 = uVar3;
        }
        if (puVar23 != (uint *)middle) {
          uVar8 = uVar3;
        }
        lVar16 = (long)iVar21;
        local_438[lVar16 * 4] = (long)first;
        local_438[lVar16 * 4 + 1] = (long)puVar7;
        *(uint **)(auStack_420 + lVar16 * 8 + -2) = puVar6;
        iVar21 = iVar21 + 1;
        auStack_420[lVar16 * 8] = uVar8 & 0xfffffffc | uVar26 & 3;
        uVar26 = uVar26 & 4 | uVar8 & 3;
        first = (saidx_t *)puVar23;
        middle = (saidx_t *)puVar24;
      }
      else {
        lVar16 = (long)iVar21;
        local_438[lVar16 * 4] = (long)puVar23;
        local_438[lVar16 * 4 + 1] = (long)puVar24;
        *(saidx_t **)(auStack_420 + lVar16 * 8 + -2) = last;
        iVar21 = iVar21 + 1;
        auStack_420[lVar16 * 8] = uVar26 & 4 | uVar3 & 3;
        uVar26 = uVar3 & 0xfffffffc | uVar26 & 3;
        middle = (saidx_t *)puVar7;
        last = (saidx_t *)puVar6;
      }
      goto LAB_001034f4;
    }
  }
  uVar15 = (ulong)((int)((uint *)middle)[-1] >> 0x1f ^ ((uint *)middle)[-1]);
  uVar3 = *middle;
  pbVar14 = T + PA[uVar15] + lVar20;
  pbVar28 = T + PA[(int)uVar3] + lVar20;
  pbVar11 = T + (long)PA[(long)(int)uVar3 + 1] + 2;
  bVar29 = pbVar28 < pbVar11;
  bVar30 = pbVar14 < T + (long)PA[uVar15 + 1] + 2;
  if ((bVar30) && (pbVar28 < pbVar11)) {
    psVar27 = T + PA[uVar15];
    psVar25 = T + PA[(int)uVar3];
    do {
      bVar12 = psVar27[lVar20];
      if (bVar12 != psVar25[lVar20]) {
        pbVar28 = psVar25 + lVar20;
        goto LAB_00103da4;
      }
      pbVar28 = psVar27 + lVar20 + 1;
      pbVar14 = psVar25 + lVar20 + 1;
      bVar29 = pbVar14 < pbVar11;
      psVar27 = psVar27 + 1;
      psVar25 = psVar25 + 1;
      bVar30 = pbVar28 < T + (long)PA[uVar15 + 1] + 2;
    } while ((bVar30) && (pbVar14 < pbVar11));
    pbVar14 = psVar27 + lVar20;
    pbVar28 = psVar25 + lVar20;
  }
  if (bVar30) {
    if (bVar29 != false) {
      bVar12 = *pbVar14;
LAB_00103da4:
      iVar10 = (uint)bVar12 - (uint)*pbVar28;
      goto LAB_00103dad;
    }
  }
  else {
    iVar10 = -(uint)bVar29;
LAB_00103dad:
    if (iVar10 == 0) {
      *middle = ~uVar3;
    }
  }
  if ((uVar26 & 1) == 0) {
    if ((uVar26 & 2) != 0) {
      uVar15 = (ulong)((int)((uint *)first)[-1] >> 0x1f ^ ((uint *)first)[-1]);
      uVar3 = *first;
      pbVar14 = T + PA[uVar15] + lVar20;
      pbVar28 = T + PA[(int)uVar3] + lVar20;
      pbVar11 = T + (long)PA[(long)(int)uVar3 + 1] + 2;
      bVar29 = pbVar28 < pbVar11;
      bVar30 = pbVar14 < T + (long)PA[uVar15 + 1] + 2;
      if ((bVar30) && (pbVar28 < pbVar11)) {
        psVar27 = T + PA[uVar15];
        psVar25 = T + PA[(int)uVar3];
        do {
          bVar12 = psVar27[lVar20];
          if (bVar12 != psVar25[lVar20]) {
            pbVar28 = psVar25 + lVar20;
            goto LAB_00103fd5;
          }
          pbVar28 = psVar27 + lVar20 + 1;
          pbVar14 = psVar25 + lVar20 + 1;
          bVar29 = pbVar14 < pbVar11;
          psVar27 = psVar27 + 1;
          psVar25 = psVar25 + 1;
          bVar30 = pbVar28 < T + (long)PA[uVar15 + 1] + 2;
        } while ((bVar30) && (pbVar14 < pbVar11));
        pbVar14 = psVar27 + lVar20;
        pbVar28 = psVar25 + lVar20;
      }
      if (bVar30) {
        if (bVar29 == false) goto LAB_00103e97;
        bVar12 = *pbVar14;
LAB_00103fd5:
        iVar10 = (uint)bVar12 - (uint)*pbVar28;
      }
      else {
        iVar10 = -(uint)bVar29;
      }
      if (iVar10 == 0) goto LAB_00103e92;
    }
  }
  else {
    uVar3 = *first;
LAB_00103e92:
    *first = ~uVar3;
  }
LAB_00103e97:
  if ((uVar26 & 4) != 0) {
    uVar15 = (ulong)((int)((uint *)last)[-1] >> 0x1f ^ ((uint *)last)[-1]);
    uVar26 = *last;
    pbVar14 = T + PA[uVar15] + lVar20;
    pbVar28 = T + PA[(int)uVar26] + lVar20;
    pbVar11 = T + (long)PA[(long)(int)uVar26 + 1] + 2;
    bVar29 = pbVar28 < pbVar11;
    bVar30 = pbVar14 < T + (long)PA[uVar15 + 1] + 2;
    if ((bVar30) && (pbVar28 < pbVar11)) {
      psVar27 = T + PA[uVar15];
      psVar25 = T + PA[(int)uVar26];
      do {
        bVar12 = psVar27[lVar20];
        if (bVar12 != psVar25[lVar20]) goto LAB_001043bc;
        pbVar28 = psVar27 + lVar20 + 1;
        pbVar14 = psVar25 + lVar20 + 1;
        bVar29 = pbVar14 < pbVar11;
        psVar27 = psVar27 + 1;
        psVar25 = psVar25 + 1;
        bVar30 = pbVar28 < T + (long)PA[uVar15 + 1] + 2;
      } while ((bVar30) && (pbVar14 < pbVar11));
      pbVar14 = psVar27 + lVar20;
      pbVar28 = psVar25 + lVar20;
    }
    if (bVar30) goto LAB_001043b2;
    goto LAB_00103f46;
  }
  goto LAB_001043d2;
joined_r0x00103f54:
  for (; buf < puVar23; puVar23 = puVar23 + -1) {
    *puVar7 = *puVar23;
    *puVar23 = puVar7[-1];
    puVar7 = puVar7 + -1;
  }
LAB_00104220:
  *puVar7 = *puVar23;
  puVar24 = puVar23;
LAB_00104225:
  *puVar24 = uVar8;
LAB_0010422d:
  if ((uVar26 & 1) == 0) {
    if ((uVar26 & 2) != 0) {
      uVar15 = (ulong)((int)((uint *)first)[-1] >> 0x1f ^ ((uint *)first)[-1]);
      uVar3 = *first;
      pbVar14 = T + PA[uVar15] + lVar20;
      pbVar28 = T + PA[(int)uVar3] + lVar20;
      pbVar11 = T + (long)PA[(long)(int)uVar3 + 1] + 2;
      bVar29 = pbVar28 < pbVar11;
      bVar30 = pbVar14 < T + (long)PA[uVar15 + 1] + 2;
      if ((bVar30) && (pbVar28 < pbVar11)) {
        psVar27 = T + PA[uVar15];
        psVar25 = T + PA[(int)uVar3];
        do {
          bVar12 = psVar27[lVar20];
          if (bVar12 != psVar25[lVar20]) {
            pbVar28 = psVar25 + lVar20;
            goto LAB_00104414;
          }
          pbVar14 = psVar27 + lVar20 + 1;
          pbVar28 = psVar25 + lVar20 + 1;
          bVar29 = pbVar28 < pbVar11;
          psVar27 = psVar27 + 1;
          psVar25 = psVar25 + 1;
          bVar30 = pbVar14 < T + (long)PA[uVar15 + 1] + 2;
        } while ((bVar30) && (pbVar28 < pbVar11));
        pbVar14 = psVar27 + lVar20;
        pbVar28 = psVar25 + lVar20;
      }
      if (bVar30) {
        if (bVar29 == false) goto LAB_0010430a;
        bVar12 = *pbVar14;
LAB_00104414:
        iVar10 = (uint)bVar12 - (uint)*pbVar28;
      }
      else {
        iVar10 = -(uint)bVar29;
      }
      if (iVar10 == 0) goto LAB_00104305;
    }
  }
  else {
    uVar3 = *first;
LAB_00104305:
    *first = ~uVar3;
  }
LAB_0010430a:
  if ((uVar26 & 4) == 0) goto LAB_001043d2;
  uVar15 = (ulong)((int)((uint *)last)[-1] >> 0x1f ^ ((uint *)last)[-1]);
  uVar26 = *last;
  pbVar14 = T + PA[uVar15] + lVar20;
  pbVar28 = T + PA[(int)uVar26] + lVar20;
  pbVar11 = T + (long)PA[(long)(int)uVar26 + 1] + 2;
  bVar29 = pbVar28 < pbVar11;
  bVar30 = pbVar14 < T + (long)PA[uVar15 + 1] + 2;
  if ((bVar30) && (pbVar28 < pbVar11)) {
    psVar27 = T + PA[uVar15];
    psVar25 = T + PA[(int)uVar26];
    do {
      bVar12 = psVar27[lVar20];
      if (bVar12 != psVar25[lVar20]) goto LAB_001043bc;
      pbVar14 = psVar27 + lVar20 + 1;
      pbVar28 = psVar25 + lVar20 + 1;
      bVar29 = pbVar28 < pbVar11;
      psVar27 = psVar27 + 1;
      psVar25 = psVar25 + 1;
      bVar30 = pbVar14 < T + (long)PA[uVar15 + 1] + 2;
    } while ((bVar30) && (pbVar28 < pbVar11));
    goto LAB_001043a4;
  }
  goto LAB_001043aa;
joined_r0x001041b3:
  for (; puVar23 < puVar6; puVar23 = puVar23 + 1) {
    *puVar7 = *puVar23;
    *puVar23 = puVar7[1];
    puVar7 = puVar7 + 1;
  }
  goto LAB_00103ff3;
joined_r0x00103f8e:
  for (; puVar23 < puVar6; puVar23 = puVar23 + 1) {
    *puVar7 = *puVar23;
    *puVar23 = puVar7[1];
    puVar7 = puVar7 + 1;
  }
LAB_00103ff3:
  *puVar7 = *puVar23;
  puVar6 = puVar23;
LAB_00103ff8:
  *puVar6 = uVar3;
LAB_00103ffb:
  if ((uVar26 & 1) == 0) {
    if ((uVar26 & 2) != 0) {
      uVar15 = (ulong)((int)((uint *)first)[-1] >> 0x1f ^ ((uint *)first)[-1]);
      uVar3 = *first;
      pbVar14 = T + PA[uVar15] + lVar20;
      pbVar28 = T + PA[(int)uVar3] + lVar20;
      pbVar11 = T + (long)PA[(long)(int)uVar3 + 1] + 2;
      bVar29 = pbVar28 < pbVar11;
      bVar30 = pbVar14 < T + (long)PA[uVar15 + 1] + 2;
      if ((bVar30) && (pbVar28 < pbVar11)) {
        psVar27 = T + PA[uVar15];
        psVar25 = T + PA[(int)uVar3];
        do {
          bVar12 = psVar27[lVar20];
          if (bVar12 != psVar25[lVar20]) {
            pbVar28 = psVar25 + lVar20;
            goto LAB_00104197;
          }
          pbVar14 = psVar27 + lVar20 + 1;
          pbVar28 = psVar25 + lVar20 + 1;
          bVar29 = pbVar28 < pbVar11;
          psVar27 = psVar27 + 1;
          psVar25 = psVar25 + 1;
          bVar30 = pbVar14 < T + (long)PA[uVar15 + 1] + 2;
        } while ((bVar30) && (pbVar28 < pbVar11));
        pbVar14 = psVar27 + lVar20;
        pbVar28 = psVar25 + lVar20;
      }
      if (bVar30) {
        if (bVar29 == false) goto LAB_001040d8;
        bVar12 = *pbVar14;
LAB_00104197:
        iVar10 = (uint)bVar12 - (uint)*pbVar28;
      }
      else {
        iVar10 = -(uint)bVar29;
      }
      if (iVar10 == 0) goto LAB_001040d3;
    }
  }
  else {
    uVar3 = *first;
LAB_001040d3:
    *first = ~uVar3;
  }
LAB_001040d8:
  if ((uVar26 & 4) != 0) {
    uVar15 = (ulong)((int)((uint *)last)[-1] >> 0x1f ^ ((uint *)last)[-1]);
    uVar26 = *last;
    pbVar14 = T + PA[uVar15] + lVar20;
    pbVar28 = T + PA[(int)uVar26] + lVar20;
    pbVar11 = T + (long)PA[(long)(int)uVar26 + 1] + 2;
    bVar29 = pbVar28 < pbVar11;
    bVar30 = pbVar14 < T + (long)PA[uVar15 + 1] + 2;
    if ((bVar30) && (pbVar28 < pbVar11)) {
      psVar27 = T + PA[uVar15];
      psVar25 = T + PA[(int)uVar26];
      do {
        bVar12 = psVar27[lVar20];
        if (bVar12 != psVar25[lVar20]) goto LAB_001043bc;
        pbVar14 = psVar27 + lVar20 + 1;
        pbVar28 = psVar25 + lVar20 + 1;
        bVar29 = pbVar28 < pbVar11;
        psVar27 = psVar27 + 1;
        psVar25 = psVar25 + 1;
        bVar30 = pbVar14 < T + (long)PA[uVar15 + 1] + 2;
      } while ((bVar30) && (pbVar28 < pbVar11));
LAB_001043a4:
      pbVar14 = psVar27 + lVar20;
      pbVar28 = psVar25 + lVar20;
    }
LAB_001043aa:
    if (bVar30) {
LAB_001043b2:
      if (bVar29 == false) goto LAB_001043d2;
      bVar12 = *pbVar14;
LAB_001043bf:
      iVar10 = (uint)bVar12 - (uint)*pbVar28;
    }
    else {
LAB_00103f46:
      iVar10 = -(uint)bVar29;
    }
    if (iVar10 == 0) {
      *last = ~uVar26;
    }
  }
LAB_001043d2:
  if (iVar21 == 0) {
    return;
  }
  lVar16 = (long)iVar21;
  iVar21 = iVar21 + -1;
  first = (saidx_t *)local_458[lVar16 * 4];
  middle = (saidx_t *)local_458[lVar16 * 4 + 1];
  last = *(saidx_t **)(local_440 + lVar16 * 8 + -2);
  uVar26 = local_440[lVar16 * 8];
  goto LAB_001034f4;
LAB_001043bc:
  pbVar28 = psVar25 + lVar20;
  goto LAB_001043bf;
}

Assistant:

static
void
ss_swapmerge(const sauchar_t *T, const saidx_t *PA,
             saidx_t *first, saidx_t *middle, saidx_t *last,
             saidx_t *buf, saidx_t bufsize, saidx_t depth) {
#define STACK_SIZE SS_SMERGE_STACKSIZE
#define GETIDX(a) ((0 <= (a)) ? (a) : (~(a)))
#define MERGE_CHECK(a, b, c)\
  do {\
    if(((c) & 1) ||\
       (((c) & 2) && (ss_compare(T, PA + GETIDX(*((a) - 1)), PA + *(a), depth) == 0))) {\
      *(a) = ~*(a);\
    }\
    if(((c) & 4) && ((ss_compare(T, PA + GETIDX(*((b) - 1)), PA + *(b), depth) == 0))) {\
      *(b) = ~*(b);\
    }\
  } while(0)
  struct { saidx_t *a, *b, *c; saint_t d; } stack[STACK_SIZE];
  saidx_t *l, *r, *lm, *rm;
  saidx_t m, len, half;
  saint_t ssize;
  saint_t check, next;

  for(check = 0, ssize = 0;;) {
    if((last - middle) <= bufsize) {
      if((first < middle) && (middle < last)) {
        ss_mergebackward(T, PA, first, middle, last, buf, depth);
      }
      MERGE_CHECK(first, last, check);
      STACK_POP(first, middle, last, check);
      continue;
    }

    if((middle - first) <= bufsize) {
      if(first < middle) {
        ss_mergeforward(T, PA, first, middle, last, buf, depth);
      }
      MERGE_CHECK(first, last, check);
      STACK_POP(first, middle, last, check);
      continue;
    }

    for(m = 0, len = MIN(middle - first, last - middle), half = len >> 1;
        0 < len;
        len = half, half >>= 1) {
      if(ss_compare(T, PA + GETIDX(*(middle + m + half)),
                       PA + GETIDX(*(middle - m - half - 1)), depth) < 0) {
        m += half + 1;
        half -= (len & 1) ^ 1;
      }
    }

    if(0 < m) {
      lm = middle - m, rm = middle + m;
      ss_blockswap(lm, middle, m);
      l = r = middle, next = 0;
      if(rm < last) {
        if(*rm < 0) {
          *rm = ~*rm;
          if(first < lm) { for(; *--l < 0;) { } next |= 4; }
          next |= 1;
        } else if(first < lm) {
          for(; *r < 0; ++r) { }
          next |= 2;
        }
      }

      if((l - first) <= (last - r)) {
        STACK_PUSH(r, rm, last, (next & 3) | (check & 4));
        middle = lm, last = l, check = (check & 3) | (next & 4);
      } else {
        if((next & 2) && (r == middle)) { next ^= 6; }
        STACK_PUSH(first, lm, l, (check & 3) | (next & 4));
        first = r, middle = rm, check = (next & 3) | (check & 4);
      }
    } else {
      if(ss_compare(T, PA + GETIDX(*(middle - 1)), PA + *middle, depth) == 0) {
        *middle = ~*middle;
      }
      MERGE_CHECK(first, last, check);
      STACK_POP(first, middle, last, check);
    }
  }
#undef STACK_SIZE
}